

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

int skipIfBlock(bool toEndc)

{
  bool bVar1;
  uint32_t uVar2;
  int c_00;
  uint32_t uVar3;
  int local_20;
  char local_1c;
  int c_1;
  int c;
  bool atLineStart;
  int token;
  uint32_t startingDepth;
  bool toEndc_local;
  
  lexer_SetMode(LEXER_NORMAL);
  uVar2 = lexer_GetIFDepth();
  c_1._3_1_ = lexerState->atLineStart & 1;
  lexerState->disableMacroArgs = true;
  lexerState->disableInterpolation = true;
  do {
    if (c_1._3_1_ == 0) goto LAB_00113a77;
    while( true ) {
      c_00 = peek();
      bVar1 = isWhitespace(c_00);
      if (!bVar1) break;
      shiftChar();
    }
    bVar1 = startsIdentifier(c_00);
    if (!bVar1) goto switchD_00113a0a_default;
    shiftChar();
    local_1c = (char)c_00;
    c = readIdentifier(local_1c);
    switch(c) {
    case 0x5d:
      lexer_IncIFDepth();
      break;
    case 0x5e:
      bVar1 = lexer_ReachedELSEBlock();
      if (bVar1) {
        fatalerror("Found ELIF after an ELSE block\n");
      }
      goto LAB_00113a4c;
    case 0x5f:
      bVar1 = lexer_ReachedELSEBlock();
      if (bVar1) {
        fatalerror("Found ELSE after an ELSE block\n");
      }
      lexer_ReachELSEBlock();
LAB_00113a4c:
      if (!toEndc) {
switchD_00113a0a_caseD_60:
        uVar3 = lexer_GetIFDepth();
        if (uVar3 == uVar2) {
LAB_00113adb:
          lexerState->disableMacroArgs = false;
          lexerState->disableInterpolation = false;
          lexerState->atLineStart = false;
          return c;
        }
        if (c == 0x60) {
          lexer_DecIFDepth();
        }
      }
      break;
    case 0x60:
      goto switchD_00113a0a_caseD_60;
    }
switchD_00113a0a_default:
    c_1._3_1_ = 0;
LAB_00113a77:
    do {
      local_20 = nextChar();
      if (local_20 == -1) {
        c = 0;
        goto LAB_00113adb;
      }
      if (local_20 == 0x5c) {
        local_20 = nextChar();
      }
      else if ((local_20 == 0xd) || (local_20 == 10)) {
        c_1._3_1_ = 1;
      }
      if ((local_20 == 0xd) || (local_20 == 10)) {
        handleCRLF(local_20);
        nextLine();
      }
    } while (((c_1._3_1_ ^ 0xff) & 1) != 0);
  } while( true );
}

Assistant:

static int skipIfBlock(bool toEndc)
{
	lexer_SetMode(LEXER_NORMAL);
	uint32_t startingDepth = lexer_GetIFDepth();
	int token;
	bool atLineStart = lexerState->atLineStart;

	// Prevent expanding macro args and symbol interpolation in this state
	lexerState->disableMacroArgs = true;
	lexerState->disableInterpolation = true;

	for (;;) {
		if (atLineStart) {
			int c;

			for (;; shiftChar()) {
				c = peek();
				if (!isWhitespace(c))
					break;
			}

			if (startsIdentifier(c)) {
				shiftChar();
				token = readIdentifier(c);
				switch (token) {
				case T_POP_IF:
					lexer_IncIFDepth();
					break;

				case T_POP_ELIF:
					if (lexer_ReachedELSEBlock())
						fatalerror("Found ELIF after an ELSE block\n");
					goto maybeFinish;

				case T_POP_ELSE:
					if (lexer_ReachedELSEBlock())
						fatalerror("Found ELSE after an ELSE block\n");
					lexer_ReachELSEBlock();
					// fallthrough
				maybeFinish:
					if (toEndc) // Ignore ELIF and ELSE, go to ENDC
						break;
					// fallthrough
				case T_POP_ENDC:
					if (lexer_GetIFDepth() == startingDepth)
						goto finish;
					if (token == T_POP_ENDC)
						lexer_DecIFDepth();
				}
			}
			atLineStart = false;
		}

		// Read chars until EOL
		do {
			int c = nextChar();

			if (c == EOF) {
				token = T_EOF;
				goto finish;
			} else if (c == '\\') {
				// Unconditionally skip the next char, including line conts
				c = nextChar();
			} else if (c == '\r' || c == '\n') {
				atLineStart = true;
			}

			if (c == '\r' || c == '\n') {
				// Handle CRLF before nextLine() since shiftChar updates colNo
				handleCRLF(c);
				// Do this both on line continuations and plain EOLs
				nextLine();
			}
		} while (!atLineStart);
	}

finish:
	lexerState->disableMacroArgs = false;
	lexerState->disableInterpolation = false;
	lexerState->atLineStart = false;

	return token;
}